

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_transaction.cpp
# Opt level: O3

RawTransactionResponseStruct *
cfd::js::api::TransactionStructApi::AddScriptHashSign
          (RawTransactionResponseStruct *__return_storage_ptr__,
          AddScriptHashSignRequestStruct *request)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  string *in_R8;
  undefined8 local_138;
  _Alloc_hider _Stack_130;
  code *local_128;
  code *local_120;
  _Any_data local_118;
  undefined1 local_108 [16];
  undefined1 local_f8 [40];
  _Alloc_hider local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  char local_a0 [16];
  undefined1 local_90 [8];
  _Rb_tree_node_base local_88;
  undefined1 local_68 [16];
  _Rb_tree_node_base local_58;
  _Base_ptr local_38;
  
  (__return_storage_ptr__->hex)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->hex).field_2;
  (__return_storage_ptr__->hex)._M_string_length = 0;
  (__return_storage_ptr__->hex).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->error).code = 0;
  (__return_storage_ptr__->error).type._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->error).type.field_2;
  (__return_storage_ptr__->error).type._M_string_length = 0;
  (__return_storage_ptr__->error).type.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->error).message._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->error).message.field_2;
  (__return_storage_ptr__->error).message._M_string_length = 0;
  (__return_storage_ptr__->error).message.field_2._M_local_buf[0] = '\0';
  p_Var1 = &(__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header._M_color
       = _S_red;
  (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header._M_left
       = &p_Var1->_M_header;
  (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header._M_right
       = &p_Var1->_M_header;
  (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var2 = &(__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var2->_M_header;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var2->_M_header;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_138._0_1_ = false;
  local_138._1_7_ = 0;
  _Stack_130._M_p = (pointer)0x0;
  local_120 = std::
              _Function_handler<cfd::js::api::RawTransactionResponseStruct_(const_cfd::js::api::AddScriptHashSignRequestStruct_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_transaction.cpp:509:20)>
              ::_M_invoke;
  local_128 = std::
              _Function_handler<cfd::js::api::RawTransactionResponseStruct_(const_cfd::js::api::AddScriptHashSignRequestStruct_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_transaction.cpp:509:20)>
              ::_M_manager;
  local_118._M_unused._M_object = local_108;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"AddScriptHashSign","");
  ExecuteStructApi<cfd::js::api::AddScriptHashSignRequestStruct,cfd::js::api::RawTransactionResponseStruct>
            ((RawTransactionResponseStruct *)local_f8,(api *)request,
             (AddScriptHashSignRequestStruct *)&local_138,
             (function<cfd::js::api::RawTransactionResponseStruct_(const_cfd::js::api::AddScriptHashSignRequestStruct_&)>
              *)&local_118,in_R8);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_f8);
  (__return_storage_ptr__->error).code = local_f8._32_4_;
  std::__cxx11::string::operator=
            ((string *)&(__return_storage_ptr__->error).type,(string *)&local_d0);
  std::__cxx11::string::operator=
            ((string *)&(__return_storage_ptr__->error).message,(string *)local_b0._M_local_buf);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(__return_storage_ptr__->error).ignore_items._M_t);
  if (local_88._M_parent != (_Base_ptr)0x0) {
    (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_color = local_88._M_color;
    (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_parent = local_88._M_parent;
    (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_left = local_88._M_left;
    (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_right = local_88._M_right;
    *(_Rb_tree_header **)((long)local_88._M_parent + 8) = p_Var1;
    (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count =
         local_68._0_8_;
    local_88._M_parent = (_Base_ptr)0x0;
    local_68._0_8_ = (_Base_ptr)0x0;
    local_88._M_left = &local_88;
    local_88._M_right = &local_88;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(__return_storage_ptr__->ignore_items)._M_t);
  if (local_58._M_parent != (_Base_ptr)0x0) {
    (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
         local_58._M_color;
    (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         local_58._M_parent;
    (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         local_58._M_left;
    (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_58._M_right;
    (local_58._M_parent)->_M_parent = &p_Var2->_M_header;
    (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)local_38;
    local_58._M_parent = (_Base_ptr)0x0;
    local_38 = (_Base_ptr)0x0;
    local_58._M_left = &local_58;
    local_58._M_right = &local_58;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_68 + 8));
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_90);
  if ((char *)local_b0._M_allocated_capacity != local_a0) {
    operator_delete((void *)local_b0._M_allocated_capacity);
  }
  if ((pointer)local_d0._M_p != (pointer)&stack0xffffffffffffff40) {
    operator_delete(local_d0._M_p);
  }
  if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
    operator_delete((void *)local_f8._0_8_);
  }
  if ((undefined1 *)local_118._M_unused._0_8_ != local_108) {
    operator_delete(local_118._M_unused._M_object);
  }
  if (local_128 != (code *)0x0) {
    (*local_128)(&local_138,&local_138,3);
  }
  return __return_storage_ptr__;
}

Assistant:

RawTransactionResponseStruct TransactionStructApi::AddScriptHashSign(
    const AddScriptHashSignRequestStruct& request) {
  auto call_func = [](const AddScriptHashSignRequestStruct& request)
      -> RawTransactionResponseStruct {  // NOLINT
    RawTransactionResponseStruct response;

    TransactionContext ctx(request.tx);
    OutPoint outpoint(Txid(request.txin.txid), request.txin.vout);
    Script redeem_script(request.txin.redeem_script);
    AddressType addr_type =
        AddressApiBase::ConvertAddressType(request.txin.hash_type);
    std::vector<SignParameter> signatures;
    const auto& params = (request.txin.sign_params.empty())
                             ? request.txin.sign_param
                             : request.txin.sign_params;
    for (const auto& sign_data : params) {
      SignParameter signature =
          TransactionStructApiBase::ConvertSignDataStructToSignParameter(
              sign_data);  // NOLINT
      signatures.emplace_back(signature);
    }

    ctx.AddScriptHashSign(
        outpoint, signatures, redeem_script, addr_type,
        redeem_script.IsMultisigScript());
    response.hex = ctx.GetHex();
    return response;
  };

  RawTransactionResponseStruct result;
  result = ExecuteStructApi<
      AddScriptHashSignRequestStruct, RawTransactionResponseStruct>(
      request, call_func, std::string(__FUNCTION__));
  return result;
}